

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

SystemSubroutine * __thiscall
slang::ast::Compilation::getSystemMethod(Compilation *this,SymbolKind typeKind,string_view name)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  uint uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  byte bVar9;
  bool bVar10;
  byte bVar11;
  uint uVar12;
  size_t sVar13;
  ulong uVar14;
  value_type_pointer __u;
  ulong uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind> local_48;
  
  local_48.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_str = name._M_str;
  local_48.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_len = name._M_len;
  local_48.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
  .super__Tuple_impl<1UL,_slang::ast::SymbolKind>.
  super__Head_base<1UL,_slang::ast::SymbolKind,_false>._M_head_impl =
       (_Head_base<1UL,_slang::ast::SymbolKind,_false>)
       (_Head_base<1UL,_slang::ast::SymbolKind,_false>)typeKind;
  sVar13 = boost::unordered::detail::foa::mulx_mix::
           mix<slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,void>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>
                     ((hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>
                       *)&this->methodMap,&local_48);
  uVar15 = sVar13 >> ((byte)(this->methodMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar16 = (sVar13 & 0xff) * 4;
  uVar6 = (&UNK_0042856c)[lVar16];
  uVar7 = (&UNK_0042856d)[lVar16];
  uVar8 = (&UNK_0042856e)[lVar16];
  bVar9 = (&UNK_0042856f)[lVar16];
  uVar14 = 0;
  do {
    pgVar2 = (this->methodMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
             .arrays.groups_;
    pgVar1 = pgVar2 + uVar15;
    bVar11 = pgVar1->m[0xf].n;
    auVar17[0] = -(pgVar1->m[0].n == uVar6);
    auVar17[1] = -(pgVar1->m[1].n == uVar7);
    auVar17[2] = -(pgVar1->m[2].n == uVar8);
    auVar17[3] = -(pgVar1->m[3].n == bVar9);
    auVar17[4] = -(pgVar1->m[4].n == uVar6);
    auVar17[5] = -(pgVar1->m[5].n == uVar7);
    auVar17[6] = -(pgVar1->m[6].n == uVar8);
    auVar17[7] = -(pgVar1->m[7].n == bVar9);
    auVar17[8] = -(pgVar1->m[8].n == uVar6);
    auVar17[9] = -(pgVar1->m[9].n == uVar7);
    auVar17[10] = -(pgVar1->m[10].n == uVar8);
    auVar17[0xb] = -(pgVar1->m[0xb].n == bVar9);
    auVar17[0xc] = -(pgVar1->m[0xc].n == uVar6);
    auVar17[0xd] = -(pgVar1->m[0xd].n == uVar7);
    auVar17[0xe] = -(pgVar1->m[0xe].n == uVar8);
    auVar17[0xf] = -(bVar11 == bVar9);
    uVar12 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
    if (uVar12 != 0) {
      ppVar3 = (this->methodMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
               .arrays.elements_;
      do {
        uVar5 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        __u = ppVar3 + uVar15 * 0xf + (ulong)uVar5;
        bVar10 = std::
                 __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_0UL,_2UL>
                 ::__eq(&local_48,&__u->first);
        if (bVar10) {
          return (__u->second).
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
        }
        uVar12 = uVar12 - 1 & uVar12;
      } while (uVar12 != 0);
      bVar11 = pgVar2[uVar15].m[0xf].n;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)sVar13 & 7] & bVar11) == 0) {
      return (SystemSubroutine *)0x0;
    }
    uVar4 = (this->methodMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
            .arrays.groups_size_mask;
    lVar16 = uVar15 + uVar14;
    uVar14 = uVar14 + 1;
    uVar15 = lVar16 + 1U & uVar4;
  } while (uVar14 <= uVar4);
  return (SystemSubroutine *)0x0;
}

Assistant:

const SystemSubroutine* Compilation::getSystemMethod(SymbolKind typeKind,
                                                     std::string_view name) const {
    auto it = methodMap.find(std::make_tuple(name, typeKind));
    if (it == methodMap.end())
        return nullptr;
    return it->second.get();
}